

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void add_reload(gen_ctx_t gen_ctx,MIR_insn_t anchor,MIR_op_t *op1,MIR_op_t *op2,MIR_type_t type,
               int to_p)

{
  MIR_context_t ctx_00;
  MIR_insn_code_t code;
  char *pcVar1;
  MIR_insn_t_conflict pMStack_40;
  MIR_insn_code_t move_code;
  MIR_insn_t new_insn;
  MIR_context_t ctx;
  int to_p_local;
  MIR_type_t type_local;
  MIR_op_t *op2_local;
  MIR_op_t *op1_local;
  MIR_insn_t anchor_local;
  gen_ctx_t gen_ctx_local;
  
  ctx_00 = gen_ctx->ctx;
  code = get_move_code(type);
  if (to_p == 0) {
    pMStack_40 = MIR_new_insn(ctx_00,code);
    gen_add_insn_before(gen_ctx,anchor,pMStack_40);
  }
  else {
    pMStack_40 = MIR_new_insn(ctx_00,code);
    gen_add_insn_after(gen_ctx,anchor,pMStack_40);
  }
  if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
    pcVar1 = "before";
    if (to_p != 0) {
      pcVar1 = "after";
    }
    fprintf((FILE *)gen_ctx->debug_file,"    Add %s insn",pcVar1);
    MIR_output_insn(ctx_00,gen_ctx->debug_file,anchor,(gen_ctx->curr_func_item->u).func,0);
    fprintf((FILE *)gen_ctx->debug_file,": ");
    MIR_output_insn(ctx_00,gen_ctx->debug_file,pMStack_40,(gen_ctx->curr_func_item->u).func,1);
  }
  return;
}

Assistant:

static void add_reload (gen_ctx_t gen_ctx, MIR_insn_t anchor, const MIR_op_t *op1,
                        const MIR_op_t *op2, MIR_type_t type, int to_p) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_insn_t new_insn;
  MIR_insn_code_t move_code = get_move_code (type);
  if (to_p) {
    new_insn = MIR_new_insn (ctx, move_code, *op1, *op2);
    gen_add_insn_after (gen_ctx, anchor, new_insn);
  } else {
    new_insn = MIR_new_insn (ctx, move_code, *op2, *op1);
    gen_add_insn_before (gen_ctx, anchor, new_insn);
  }
  DEBUG (2, {
    fprintf (debug_file, "    Add %s insn", (to_p ? "after" : "before"));
    MIR_output_insn (ctx, debug_file, anchor, curr_func_item->u.func, FALSE);
    fprintf (debug_file, ": ");
    MIR_output_insn (ctx, debug_file, new_insn, curr_func_item->u.func, TRUE);
  });
}